

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O1

void __thiscall psy::C::SemanticModelTester::case0353(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppFVar2;
  _func_int **pp_Var3;
  MemberDeclarationSymbol *pMVar4;
  TypeKind TVar5;
  BasicTypeKind BVar6;
  int iVar7;
  FieldDeclarationSyntax *pFVar8;
  Lexeme *pLVar9;
  Type *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 uVar11;
  undefined4 extraout_var_04;
  ostream *poVar12;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  fldDeclSyms0;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  fldDeclSyms1;
  string local_90;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  local_70;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  local_50;
  SemanticModel *local_38;
  TestSuite *local_30;
  
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"struct x { int y , z ; double * k, w ; } ;","");
  pppFVar2 = &local_70.
              super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pppFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffc8,(string *)this,&local_90);
  if (local_70.
      super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)pppFVar2) {
    operator_delete(local_70.
                    super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pp_Var3 = local_30[5]._vptr_TestSuite;
  pFVar8 = (FieldDeclarationSyntax *)(**(code **)(**(long **)(pp_Var3[7] + 8) + 0xe0))();
  SemanticModel::fieldsFor(&local_70,local_38,pFVar8);
  if ((long)local_70.
            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_70.
            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x291);
    std::endl<char,std::char_traits<char>>(poVar12);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pMVar4 = &(*local_70.
              super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_MemberDeclarationSymbol;
  if (pMVar4 == (MemberDeclarationSymbol *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
    poVar12 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
               ,99);
    iVar7 = 0x294;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  }
  else {
    pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
    iVar7 = std::__cxx11::string::compare((char *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_90._M_dataplus._M_p,local_90._M_string_length
                          );
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"y",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x295);
      std::endl<char,std::char_traits<char>>(poVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003ee448;
    }
    pTVar10 = MemberDeclarationSymbol::type(pMVar4);
    TVar5 = Type::kind(pTVar10);
    if (TVar5 == Basic) {
      pTVar10 = MemberDeclarationSymbol::type(pMVar4);
      iVar7 = (*pTVar10->_vptr_Type[5])(pTVar10);
      BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var,iVar7));
      if (BVar6 == Int_S) {
        pMVar4 = &local_70.
                  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->super_MemberDeclarationSymbol;
        pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
        Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
        iVar7 = std::__cxx11::string::compare((char *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (iVar7 == 0) {
          pTVar10 = MemberDeclarationSymbol::type(pMVar4);
          TVar5 = Type::kind(pTVar10);
          if (TVar5 == Basic) {
            pTVar10 = MemberDeclarationSymbol::type(pMVar4);
            iVar7 = (*pTVar10->_vptr_Type[5])(pTVar10);
            BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar7));
            if (BVar6 == Int_S) {
              pFVar8 = (FieldDeclarationSyntax *)
                       (**(code **)(**(long **)(*(long *)(pp_Var3[7] + 0x10) + 8) + 0xe0))();
              SemanticModel::fieldsFor(&local_50,local_38,pFVar8);
              if ((long)local_50.
                        super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_50.
                        super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                           ,99);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
                poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x2a0);
                std::endl<char,std::char_traits<char>>(poVar12);
                uVar11 = __cxa_allocate_exception(1);
                __cxa_throw(uVar11,&TestFailed::typeinfo,0);
              }
              pMVar4 = &(*local_50.
                          super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_MemberDeclarationSymbol;
              if (pMVar4 == (MemberDeclarationSymbol *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"true",4);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
                poVar12 = (ostream *)&std::cout;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                           ,99);
                iVar7 = 0x2a3;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              }
              else {
                pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
                Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
                iVar7 = std::__cxx11::string::compare((char *)&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != paVar1) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                if (iVar7 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                  pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
                  Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_90._M_dataplus._M_p,
                                       local_90._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"k",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             ,99);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
                  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x2a4);
                  std::endl<char,std::char_traits<char>>(poVar12);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_90._M_dataplus._M_p != paVar1) {
                    operator_delete(local_90._M_dataplus._M_p,
                                    local_90.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_003eec3e;
                }
                pTVar10 = MemberDeclarationSymbol::type(pMVar4);
                TVar5 = Type::kind(pTVar10);
                if (TVar5 == Pointer) {
                  pMVar4 = &local_50.
                            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]->
                            super_MemberDeclarationSymbol;
                  if (pMVar4 == (MemberDeclarationSymbol *)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"\t\tExpression is NOT ",0x14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"true",4);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"\t\t",2);
                    poVar12 = (ostream *)&std::cout;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               ,99);
                    iVar7 = 0x2a8;
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  }
                  else {
                    pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
                    Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
                    iVar7 = std::__cxx11::string::compare((char *)&local_90);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != paVar1) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    if (iVar7 != 0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                      pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
                      Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
                      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,local_90._M_dataplus._M_p,
                                           local_90._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,"\t\tExpected: ",0xc);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"w",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                 ,99);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
                      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x2a9);
                      std::endl<char,std::char_traits<char>>(poVar12);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_90._M_dataplus._M_p != paVar1) {
                        operator_delete(local_90._M_dataplus._M_p,
                                        local_90.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_003eef1e;
                    }
                    pTVar10 = MemberDeclarationSymbol::type(pMVar4);
                    TVar5 = Type::kind(pTVar10);
                    if (TVar5 == Basic) {
                      pTVar10 = MemberDeclarationSymbol::type(pMVar4);
                      iVar7 = (*pTVar10->_vptr_Type[5])(pTVar10);
                      BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar7));
                      if (BVar6 == Double) {
                        if (local_50.
                            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_50.
                                          super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_50.
                                                super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_50.
                                                super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_70.
                            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_70.
                                          super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_70.
                                                super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_70.
                                                super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        return;
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                      pTVar10 = MemberDeclarationSymbol::type(pMVar4);
                      iVar7 = (*pTVar10->_vptr_Type[5])(pTVar10);
                      BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var_04,iVar7));
                      poVar12 = C::operator<<((ostream *)&std::cout,BVar6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,"\t\tExpected: ",0xc);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"double",6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                 ,99);
                      iVar7 = 0x2ab;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                      pTVar10 = MemberDeclarationSymbol::type(pMVar4);
                      TVar5 = Type::kind(pTVar10);
                      poVar12 = ::operator<<((ostream *)&std::cout,TVar5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,"\t\tExpected: ",0xc);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Basic",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                 ,99);
                      iVar7 = 0x2aa;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
                    }
                  }
                  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar7);
                  std::endl<char,std::char_traits<char>>(poVar12);
LAB_003eef1e:
                  uVar11 = __cxa_allocate_exception(1);
                  __cxa_throw(uVar11,&TestFailed::typeinfo,0);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n!\tFAIL\n",8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\t\tActual  : ",0xc);
                pTVar10 = MemberDeclarationSymbol::type(pMVar4);
                TVar5 = Type::kind(pTVar10);
                poVar12 = ::operator<<((ostream *)&std::cout,TVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Pointer",7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                           ,99);
                iVar7 = 0x2a5;
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
              }
              poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar7);
              std::endl<char,std::char_traits<char>>(poVar12);
LAB_003eec3e:
              uVar11 = __cxa_allocate_exception(1);
              __cxa_throw(uVar11,&TestFailed::typeinfo,0);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tActual  : ",0xc);
            pTVar10 = MemberDeclarationSymbol::type(pMVar4);
            iVar7 = (*pTVar10->_vptr_Type[5])(pTVar10);
            BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var_03,iVar7));
            poVar12 = C::operator<<((ostream *)&std::cout,BVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"signed int",10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                       ,99);
            iVar7 = 0x29c;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\n!\tFAIL\n",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\t\tActual  : ",0xc);
            pTVar10 = MemberDeclarationSymbol::type(pMVar4);
            TVar5 = Type::kind(pTVar10);
            poVar12 = ::operator<<((ostream *)&std::cout,TVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Basic",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                       ,99);
            iVar7 = 0x29b;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
          }
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar7);
          std::endl<char,std::char_traits<char>>(poVar12);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\t\tActual  : ",0xc);
          pLVar9 = &MemberDeclarationSymbol::name(pMVar4)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_90,pLVar9);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_90._M_dataplus._M_p,
                               local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"z",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                     ,99);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x29a);
          std::endl<char,std::char_traits<char>>(poVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        uVar11 = __cxa_allocate_exception(1);
        __cxa_throw(uVar11,&TestFailed::typeinfo,0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pTVar10 = MemberDeclarationSymbol::type(pMVar4);
      iVar7 = (*pTVar10->_vptr_Type[5])(pTVar10);
      BVar6 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar7));
      poVar12 = C::operator<<((ostream *)&std::cout,BVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"signed int",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      iVar7 = 0x297;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pTVar10 = MemberDeclarationSymbol::type(pMVar4);
      TVar5 = Type::kind(pTVar10);
      poVar12 = ::operator<<((ostream *)&std::cout,TVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Basic",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      iVar7 = 0x296;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,":",1);
    }
  }
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar7);
  std::endl<char,std::char_traits<char>>(poVar12);
LAB_003ee448:
  uVar11 = __cxa_allocate_exception(1);
  __cxa_throw(uVar11,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0353()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>("struct x { int y , z ; double * k, w ; } ;");

    auto tySpec = tyDeclNode->typeSpecifier();

    auto fldDeclNode0 = tySpec->declarations()->value->asFieldDeclaration();
    std::vector<const FieldDeclarationSymbol*> fldDeclSyms0 = semaModel->fieldsFor(fldDeclNode0);
    PSY_EXPECT_EQ_INT(fldDeclSyms0.size(), 2);

    const FieldDeclarationSymbol* fldDeclSym0_0 = fldDeclSyms0[0];
    PSY_EXPECT_TRUE(fldDeclSym0_0);
    PSY_EXPECT_EQ_STR(fldDeclSym0_0->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(fldDeclSym0_0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym0_0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    const FieldDeclarationSymbol* fldDeclSym0_1 = fldDeclSyms0[1];
    PSY_EXPECT_EQ_STR(fldDeclSym0_1->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(fldDeclSym0_1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym0_1->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    auto fldDeclNode1 = tySpec->declarations()->next->value->asFieldDeclaration();
    std::vector<const FieldDeclarationSymbol*> fldDeclSyms1 = semaModel->fieldsFor(fldDeclNode1);
    PSY_EXPECT_EQ_INT(fldDeclSyms1.size(), 2);

    const FieldDeclarationSymbol* fldDeclSym1_0 = fldDeclSyms1[0];
    PSY_EXPECT_TRUE(fldDeclSym1_0);
    PSY_EXPECT_EQ_STR(fldDeclSym1_0->name()->valueText(), "k");
    PSY_EXPECT_EQ_ENU(fldDeclSym1_0->type()->kind(), TypeKind::Pointer, TypeKind);

    const FieldDeclarationSymbol* fldDeclSym1_1 = fldDeclSyms1[1];
    PSY_EXPECT_TRUE(fldDeclSym1_1);
    PSY_EXPECT_EQ_STR(fldDeclSym1_1->name()->valueText(), "w");
    PSY_EXPECT_EQ_ENU(fldDeclSym1_1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym1_1->type()->asBasicType()->kind(), BasicTypeKind::Double, BasicTypeKind);
}